

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::TiledInputFile::rawTileData
          (TiledInputFile *this,int *dx,int *dy,int *lx,int *ly,char **pixelData,int *pixelDataSize)

{
  uint lx_00;
  uint ly_00;
  int dy_00;
  pthread_mutex_t *__mutex;
  IStream *pIVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  Int64 *pIVar5;
  ArgExc *pAVar6;
  InputStreamMutex *pIVar7;
  pointer_____offset_0x10___ *ppuVar8;
  char *pcVar9;
  Data *pDVar10;
  stringstream _iex_replace_s;
  int local_200;
  int local_1fc;
  uint local_1f8;
  uint local_1f4;
  TiledInputFile *local_1f0;
  int local_1e4;
  pthread_mutex_t *local_1e0;
  TileBuffer *local_1d8;
  int *local_1d0;
  char **local_1c8;
  int *local_1c0;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  local_1c8 = pixelData;
  iVar4 = pthread_mutex_lock(__mutex);
  local_1f0 = this;
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  local_1fc = *dx;
  iVar4 = *dy;
  local_1f8 = *lx;
  local_1f4 = *ly;
  local_1e0 = __mutex;
  local_1d0 = dy;
  local_1c0 = dx;
  bVar3 = isValidTile(this,local_1fc,iVar4,local_1f8,local_1f4);
  piVar2 = local_1c0;
  if (!bVar3) {
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar6,"Tried to read a tile outside the image file\'s data window.");
    __cxa_throw(pAVar6,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
  }
  pDVar10 = this->_data;
  pIVar7 = pDVar10->_streamData;
  local_1d8 = *(pDVar10->tileBuffers).
               super__Vector_base<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_1e4 = iVar4;
  if ((pDVar10->version & 0x1000) == 0) {
LAB_0046472c:
    (*pIVar7->is->_vptr_IStream[3])(pIVar7->is,&local_200,4);
    *piVar2 = local_200;
    (*pIVar7->is->_vptr_IStream[3])(pIVar7->is,&local_200,4);
    *local_1d0 = local_200;
    (*pIVar7->is->_vptr_IStream[3])(pIVar7->is,&local_200,4);
    *lx = local_200;
    (*pIVar7->is->_vptr_IStream[3])(pIVar7->is,&local_200,4);
    *ly = local_200;
    (*pIVar7->is->_vptr_IStream[3])(pIVar7->is,&local_200,4);
    *pixelDataSize = local_200;
    if (local_200 <= (int)pDVar10->tileBufferSize) {
      (*pIVar7->is->_vptr_IStream[3])(pIVar7->is,local_1d8->buffer);
      pIVar7->currentPosition = (long)*pixelDataSize + pIVar7->currentPosition + 0x14;
      lx_00 = *lx;
      ly_00 = *ly;
      if ((((int)(ly_00 | lx_00) < 0) ||
          (((pDVar10 = local_1f0->_data, lx_00 != ly_00 &&
            ((pDVar10->tileDesc).mode == MIPMAP_LEVELS)) || (pDVar10->numXLevels <= (int)lx_00))))
         || (pDVar10->numYLevels <= (int)ly_00)) {
LAB_004648b5:
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar9 = "File contains an invalid tile";
      }
      else {
        iVar4 = *piVar2;
        dy_00 = *local_1d0;
        bVar3 = isValidTile(local_1f0,iVar4,dy_00,lx_00,ly_00);
        if (!bVar3) goto LAB_004648b5;
        if (((pDVar10->version & 0x1000) == 0) ||
           (((local_1f4 == ly_00 && (local_1f8 == lx_00)) &&
            ((local_1fc == iVar4 && (local_1e4 == dy_00)))))) {
          *local_1c8 = local_1d8->buffer;
          pthread_mutex_unlock(local_1e0);
          return;
        }
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        pcVar9 = "rawTileData read the wrong tile";
      }
      Iex_2_5::ArgExc::ArgExc(pAVar6,pcVar9);
      ppuVar8 = &Iex_2_5::ArgExc::typeinfo;
      goto LAB_004648df;
    }
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar9 = "Unexpected tile block length.";
  }
  else {
    pIVar1 = pIVar7->is;
    pIVar5 = TileOffsets::operator()(&pDVar10->tileOffsets,local_1fc,iVar4,local_1f8,local_1f4);
    (*pIVar1->_vptr_IStream[6])(pIVar1,*pIVar5);
    pDVar10 = local_1f0->_data;
    pIVar7 = pDVar10->_streamData;
    if ((pDVar10->version & 0x1000) == 0) goto LAB_0046472c;
    (*pIVar7->is->_vptr_IStream[3])(pIVar7->is,&local_200,4);
    if (local_200 == pDVar10->partNumber) goto LAB_0046472c;
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    pcVar9 = "Unexpected part number in readNextTileData";
  }
  Iex_2_5::InputExc::InputExc((InputExc *)pAVar6,pcVar9);
  ppuVar8 = &Iex_2_5::InputExc::typeinfo;
LAB_004648df:
  __cxa_throw(pAVar6,ppuVar8,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
TiledInputFile::rawTileData (int &dx, int &dy,
			     int &lx, int &ly,
                             const char *&pixelData,
			     int &pixelDataSize)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (!isValidTile (dx, dy, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tried to read a tile outside "
			       "the image file's data window.");

        TileBuffer *tileBuffer = _data->getTileBuffer (0);

        //
        // if file is a multipart file, we have to seek to the required tile
        // since we don't know where the file pointer is
        //
        int old_dx=dx;
        int old_dy=dy;
        int old_lx=lx;
        int old_ly=ly;
        if(isMultiPart(version()))
        {
            _data->_streamData->is->seekg(_data->tileOffsets(dx,dy,lx,ly));
        }
        readNextTileData (_data->_streamData, _data, dx, dy, lx, ly,
			  tileBuffer->buffer,
                          pixelDataSize);

        if ( !isValidLevel(lx,ly) || !isValidTile (dx, dy, lx, ly) )
            throw IEX_NAMESPACE::ArgExc ("File contains an invalid tile");


        if(isMultiPart(version()))
        {
            if (old_dx!=dx || old_dy !=dy || old_lx!=lx || old_ly!=ly)
            {
                throw IEX_NAMESPACE::ArgExc ("rawTileData read the wrong tile");
            }
        }
        else
        {
             if(!isValidTile (dx, dy, lx, ly) )
             {
                 throw IEX_NAMESPACE::IoExc ("rawTileData read an invalid tile");
             }
        }
        pixelData = tileBuffer->buffer;
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading pixel data from image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}